

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldMapTests::TestsetField_16FieldsAlreadyExist_fieldSet::RunImpl
          (TestsetField_16FieldsAlreadyExist_fieldSet *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  FieldBase expectedTag18;
  int local_100;
  int local_fc;
  TestDetails local_f8;
  FieldBase actualTag18;
  FieldMap fieldMap;
  
  expectedTag18._vptr_FieldBase._0_4_ = 2;
  expectedTag18._4_8_ = 0;
  expectedTag18._12_8_ = 0;
  expectedTag18.m_string._4_8_ = 0;
  FIX::FieldMap::FieldMap(&fieldMap,(message_order *)&expectedTag18);
  FIX::shared_array<int>::~shared_array((shared_array<int> *)&expectedTag18.m_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field1",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,1,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field2",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,2,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field3",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,3,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field4",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,4,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field5",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,5,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field6",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,6,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field7",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,7,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field8",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,8,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field9",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,9,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field10",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,10,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field11",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,0xb,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field12",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,0xc,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field13",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,0xd,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field14",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,0xe,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field15",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,0xf,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field16",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,0x10,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field17",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,0x11,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedTag18,"field18",(allocator<char> *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,0x12,(string *)&expectedTag18);
  std::__cxx11::string::~string((string *)&expectedTag18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&actualTag18,"field18_new",(allocator<char> *)&local_f8);
  FIX::FieldBase::FieldBase(&expectedTag18,0x12,(string *)&actualTag18);
  std::__cxx11::string::~string((string *)&actualTag18);
  FIX::FieldMap::setField(&fieldMap,&expectedTag18,true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"",(allocator<char> *)&local_100);
  FIX::FieldBase::FieldBase(&actualTag18,0x12,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  FIX::FieldMap::getFieldIfSet(&fieldMap,&actualTag18);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_100 = 0x12;
  local_fc = actualTag18.m_tag;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_f8,*ppTVar3,0x99);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_100,&local_fc,&local_f8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_f8,*ppTVar3,0x9a);
  UnitTest::CheckEqual<char[12],std::__cxx11::string>
            (pTVar1,(char (*) [12])"field18_new",&actualTag18.m_string,&local_f8);
  FIX::FieldBase::~FieldBase(&actualTag18);
  FIX::FieldBase::~FieldBase(&expectedTag18);
  FIX::FieldMap::~FieldMap(&fieldMap);
  return;
}

Assistant:

TEST(setField_16FieldsAlreadyExist_fieldSet)
{
    FieldMap fieldMap;
    fieldMap.setField(1, "field1");
    fieldMap.setField(2, "field2");
    fieldMap.setField(3, "field3");
    fieldMap.setField(4, "field4");
    fieldMap.setField(5, "field5");
    fieldMap.setField(6, "field6");

    fieldMap.setField(7, "field7");
    fieldMap.setField(8, "field8");
    fieldMap.setField(9, "field9");
    fieldMap.setField(10, "field10");
    fieldMap.setField(11, "field11");
    fieldMap.setField(12, "field12");
    fieldMap.setField(13, "field13");
    fieldMap.setField(14, "field14");
    fieldMap.setField(15, "field15");
    fieldMap.setField(16, "field16");
    fieldMap.setField(17, "field17");
    fieldMap.setField(18, "field18");

    FieldBase expectedTag18(18, "field18_new");

    fieldMap.setField(expectedTag18);

    FieldBase actualTag18(18, "");
    fieldMap.getFieldIfSet(actualTag18);

    CHECK_EQUAL(18, actualTag18.getTag());
    CHECK_EQUAL("field18_new", actualTag18.getString());
}